

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O0

void __thiscall amrex::Print::Print(Print *this,ostream *os_)

{
  long lVar1;
  int iVar2;
  MPI_Comm MVar3;
  streamsize __prec;
  undefined8 in_RSI;
  int *in_RDI;
  
  iVar2 = ParallelContext::IOProcessorNumberSub();
  *in_RDI = iVar2;
  MVar3 = ParallelContext::CommunicatorSub();
  in_RDI[1] = MVar3;
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 4));
  lVar1 = *(long *)(*(long *)(in_RDI + 4) + -0x18);
  __prec = std::ios_base::precision
                     ((ios_base *)
                      ((long)*(long **)(in_RDI + 2) + *(long *)(**(long **)(in_RDI + 2) + -0x18)));
  std::ios_base::precision((ios_base *)((long)in_RDI + lVar1 + 0x10),__prec);
  return;
}

Assistant:

explicit Print (std::ostream& os_ = amrex::OutStream())
            : rank(ParallelContext::IOProcessorNumberSub())
            , comm(ParallelContext::CommunicatorSub())
            , os(os_)
            { ss.precision(os.precision()); }